

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tape.cpp
# Opt level: O2

bool has_screen_changes(void)

{
  byte *pbVar1;
  byte *pbVar2;
  bool bVar3;
  long lVar4;
  int i;
  CDeviceSlot *pCVar5;
  long lVar6;
  
  pCVar5 = CDevice::GetSlot(Device,1);
  pbVar2 = pCVar5->Page->RAM;
  lVar6 = 0;
  do {
    if (lVar6 == 0x1800) {
      lVar6 = -0x300;
      do {
        bVar3 = lVar6 != 0;
        if (lVar6 == 0) {
          return bVar3;
        }
        lVar4 = lVar6 + 0x1b00;
        lVar6 = lVar6 + 1;
      } while (pbVar2[lVar4] == '8');
      return bVar3;
    }
    pbVar1 = pbVar2 + lVar6;
    lVar6 = lVar6 + 1;
  } while (*pbVar1 == '\0');
  return true;
}

Assistant:

static bool has_screen_changes() {
	unsigned char *pscr = (unsigned char*)Device->GetSlot(1)->Page->RAM;

	for (int i=0; i < 0x1800;i++) {
		if (0 != pscr[i]) {
			return true;
		}
	}

	for (int i=0x1800; i < 0x1B00;i++) {
		if (0x38 != pscr[i]) {
			return true;
		}
	}

	return false;
}